

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
          (BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,uint *key,FloatSymEquivalenceClass **value)

{
  BaseDictionary<unsigned_int,BackwardPass::FloatSymEquivalenceClass*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  undefined8 *puVar2;
  hash_t hashCode;
  long lVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined4 *puVar8;
  long lVar9;
  uint depth;
  uint uVar10;
  int iVar11;
  long lVar12;
  
  lVar12 = *(long *)this;
  if (lVar12 == 0) {
    BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar12 = *(long *)this;
  }
  hashCode = *key * 2 + 1;
  uVar6 = BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar10 = *(uint *)(lVar12 + (ulong)uVar6 * 4);
  if ((int)uVar10 < 0) {
    depth = 0;
  }
  else {
    depth = 0;
    do {
      puVar2 = (undefined8 *)(*(long *)(this + 8) + (ulong)uVar10 * 0x10);
      if (*(uint *)(*(long *)(this + 8) + 0xc + (ulong)uVar10 * 0x10) == *key) {
        if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
        }
        *puVar2 = *value;
        return uVar10;
      }
      depth = depth + 1;
      uVar10 = *(uint *)(puVar2 + 1);
    } while (-1 < (int)uVar10);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
  }
  if (*(int *)(this + 0x28) == 0) {
    iVar7 = *(int *)(this + 0x18);
    iVar11 = *(int *)(this + 0x20);
    if (iVar11 == iVar7) {
      BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Resize((BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)this);
      uVar6 = BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
      iVar7 = *(int *)(this + 0x18);
      iVar11 = *(int *)(this + 0x20);
    }
    *(int *)(this + 0x20) = iVar11 + 1;
    if (iVar7 < iVar11 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f1,"(count <= size)","count <= size");
      if (!bVar5) goto LAB_003f4fb8;
      *puVar8 = 0;
      iVar7 = *(int *)(this + 0x18);
    }
    if (iVar7 <= iVar11) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f2,"(index < size)","index < size");
      if (!bVar5) goto LAB_003f4fb8;
      *puVar8 = 0;
    }
  }
  else {
    if (*(int *)(this + 0x28) < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar5) goto LAB_003f4fb8;
      *puVar8 = 0;
    }
    iVar11 = *(int *)(this + 0x24);
    if (iVar11 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar5) goto LAB_003f4fb8;
      *puVar8 = 0;
      iVar11 = *(int *)(this + 0x24);
    }
    if (*(int *)(this + 0x20) <= iVar11) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar5) {
LAB_003f4fb8:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
      iVar11 = *(int *)(this + 0x24);
    }
    pBVar1 = this + 0x28;
    *(int *)pBVar1 = *(int *)pBVar1 + -1;
    if (*(int *)pBVar1 != 0) {
      iVar7 = BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetNextFreeEntryIndex((EntryType *)((long)iVar11 * 0x10 + *(long *)(this + 8)));
      *(int *)(this + 0x24) = iVar7;
    }
  }
  lVar12 = *(long *)(this + 8);
  lVar9 = (long)iVar11 * 0x10;
  uVar10 = *key;
  *(FloatSymEquivalenceClass **)(lVar12 + lVar9) = *value;
  *(uint *)(lVar12 + 0xc + lVar9) = uVar10;
  lVar3 = *(long *)this;
  *(undefined4 *)(lVar12 + 8 + lVar9) = *(undefined4 *)(lVar3 + (ulong)uVar6 * 4);
  *(int *)(lVar3 + (ulong)uVar6 * 4) = iVar11;
  uVar6 = 0;
  iVar7 = iVar11;
  do {
    iVar7 = *(int *)(lVar12 + 8 + (long)iVar7 * 0x10);
    uVar6 = uVar6 + 1;
  } while (iVar7 != -1);
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar6);
  }
  return iVar11;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }